

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::GetLanguages
          (cmTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  cmGlobalGenerator *this_00;
  cmGeneratorTarget *this_01;
  pointer ppcVar1;
  pointer ppcVar2;
  cmTarget **ppcVar3;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> objectLibraries;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  string objLib;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  cmTarget *tgt;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_b8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_98;
  string local_78;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_58;
  cmTarget *local_38;
  
  local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,&local_58,config);
  if (local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar2 = local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      cmSourceFile::GetLanguage_abi_cxx11_(&local_78,*ppcVar2);
      if (local_78._M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,&local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cmTarget **)0x0;
  local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmTarget **)0x0;
  local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (cmTarget **)0x0;
  local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->Makefile->GeneratorTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GetObjectLibrariesCMP0026(this,&local_b8);
    ppcVar3 = local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
    this_01 = cmGlobalGenerator::GetGeneratorTarget(this_00,this);
    cmGeneratorTarget::GetExternalObjects(this_01,&local_98,config);
    ppcVar3 = local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar1 = local_98.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_78,*ppcVar1);
        local_38 = cmMakefile::FindTargetToUse(this->Makefile,&local_78,false);
        if (local_38 != (cmTarget *)0x0) {
          if (local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                      ((vector<cmTarget*,std::allocator<cmTarget*>> *)&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_38);
          }
          else {
            *local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_38;
            local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        ppcVar1 = ppcVar1 + 1;
        ppcVar3 = local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (ppcVar1 !=
               local_98.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  for (; ppcVar3 !=
         local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    GetLanguages(*ppcVar3,languages,config);
  }
  if (local_98.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cmTarget **)0x0) {
    operator_delete(local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmTarget::GetLanguages(std::set<std::string>& languages,
                            const std::string& config) const
{
  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for(std::vector<cmSourceFile*>::const_iterator
        i = sourceFiles.begin(); i != sourceFiles.end(); ++i)
    {
    const std::string& lang = (*i)->GetLanguage();
    if(!lang.empty())
      {
      languages.insert(lang);
      }
    }

  std::vector<cmTarget*> objectLibraries;
  std::vector<cmSourceFile const*> externalObjects;
  if (this->Makefile->GetGeneratorTargets().empty())
    {
    this->GetObjectLibrariesCMP0026(objectLibraries);
    }
  else
    {
    cmGeneratorTarget* gt = this->Makefile->GetGlobalGenerator()
                                ->GetGeneratorTarget(this);
    gt->GetExternalObjects(externalObjects, config);
    for(std::vector<cmSourceFile const*>::const_iterator
          i = externalObjects.begin(); i != externalObjects.end(); ++i)
      {
      std::string objLib = (*i)->GetObjectLibrary();
      if (cmTarget* tgt = this->Makefile->FindTargetToUse(objLib))
        {
        objectLibraries.push_back(tgt);
        }
      }
    }
  for(std::vector<cmTarget*>::const_iterator
      i = objectLibraries.begin(); i != objectLibraries.end(); ++i)
    {
    (*i)->GetLanguages(languages, config);
    }
}